

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O0

void __thiscall OpenMD::Component::~Component(Component *this)

{
  DataHolder *in_RDI;
  
  ((ParameterBase *)&in_RDI->_vptr_DataHolder)->_vptr_ParameterBase =
       (_func_int **)&PTR__Component_0037dce0;
  Parameter<int>::~Parameter((Parameter<int> *)0x28739d);
  Parameter<int>::~Parameter((Parameter<int> *)0x2873ae);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  DataHolder::~DataHolder(in_RDI);
  return;
}

Assistant:

Component::~Component() {}